

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VM.cpp
# Opt level: O1

void __thiscall luna::VM::CopyVarArg(VM *this,Value *a,Instruction i)

{
  State *pSVar1;
  Closure *this_00;
  _List_node_base *p_Var2;
  _List_node_base **pp_Var3;
  int iVar4;
  int iVar5;
  Function *this_01;
  _List_node_base *p_Var6;
  int iVar7;
  Value *pVVar8;
  char *__assertion;
  
  pSVar1 = this->state_;
  if ((pSVar1->calls_).super__List_base<luna::CallInfo,_std::allocator<luna::CallInfo>_>._M_impl.
      _M_node.super__List_node_base._M_next == (_List_node_base *)&pSVar1->calls_) {
    __assertion = "!state_->calls_.empty()";
  }
  else {
    p_Var6 = (pSVar1->calls_).super__List_base<luna::CallInfo,_std::allocator<luna::CallInfo>_>.
             _M_impl._M_node.super__List_node_base._M_prev;
    if ((p_Var6[1]._M_prev != (_List_node_base *)0x0) &&
       (this_00 = (Closure *)(p_Var6[1]._M_prev)->_M_next, this_00 != (Closure *)0x0)) {
      this_01 = Closure::GetPrototype(this_00);
      p_Var2 = p_Var6[1]._M_next;
      p_Var6 = p_Var6[1]._M_prev;
      iVar4 = Function::FixedArgCount(this_01);
      iVar4 = (int)((ulong)((long)p_Var2 - (long)(p_Var6 + 1)) >> 4) - iVar4;
      iVar5 = Function::FixedArgCount(this_01);
      p_Var6 = p_Var6 + (long)iVar5 + 1;
      if ((i.opcode_ & 0xffff) != 0xffff) {
        iVar5 = (int)(short)i.opcode_;
        if (iVar5 <= iVar4) {
          iVar4 = iVar5;
        }
        iVar7 = iVar4;
        if (iVar4 < 1) {
          iVar4 = 0;
        }
        else {
          do {
            a->type_ = *(ValueT *)&p_Var6->_M_prev;
            pp_Var3 = &p_Var6->_M_next;
            p_Var6 = p_Var6 + 1;
            a->field_0 = (anon_union_8_9_8deb4486_for_Value_0)*pp_Var3;
            a = a + 1;
            iVar7 = iVar7 + -1;
          } while (iVar7 != 0);
        }
        iVar7 = iVar5 - iVar4;
        if (iVar7 != 0 && iVar4 <= iVar5) {
          do {
            (a->field_0).obj_ = (GCObject *)0x0;
            a->type_ = ValueT_Nil;
            a = a + 1;
            iVar7 = iVar7 + -1;
          } while (iVar7 != 0);
        }
        return;
      }
      pVVar8 = a;
      if (0 < iVar4) {
        do {
          pVVar8->type_ = *(ValueT *)&p_Var6->_M_prev;
          pp_Var3 = &p_Var6->_M_next;
          p_Var6 = p_Var6 + 1;
          a = pVVar8 + 1;
          pVVar8->field_0 = (anon_union_8_9_8deb4486_for_Value_0)*pp_Var3;
          iVar4 = iVar4 + -1;
          pVVar8 = a;
        } while (iVar4 != 0);
      }
      Stack::SetNewTop(&this->state_->stack_,a);
      return;
    }
    __assertion = "call->func_ && call->func_->closure_";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/VM.cpp",
                0x17b,"void luna::VM::CopyVarArg(Value *, Instruction)");
}

Assistant:

void VM::CopyVarArg(Value *a, Instruction i)
    {
        GET_CALLINFO_AND_PROTO();
        auto arg = call->func_ + 1;
        int total_args = call->register_ - arg;
        int vararg_count = total_args - proto->FixedArgCount();

        arg += proto->FixedArgCount();
        int expect_count = Instruction::GetParamsBx(i);
        if (expect_count == EXP_VALUE_COUNT_ANY)
        {
            for (int i = 0; i < vararg_count; ++i)
                *a++ = *arg++;
            state_->stack_.SetNewTop(a);
        }
        else
        {
            int i = 0;
            for (; i < vararg_count && i < expect_count; ++i)
                *a++ = *arg++;
            for (; i < expect_count; ++i, ++a)
                a->SetNil();
        }
    }